

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

string * libcellml::convertNonSiUnits(string *__return_storage_ptr__,string *unitsName)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  iVar3 = std::__cxx11::string::compare((char *)unitsName);
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "litre";
    pcVar2 = "litre";
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)unitsName);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar3 != 0) {
      pcVar1 = (unitsName->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + unitsName->_M_string_length);
      return __return_storage_ptr__;
    }
    pcVar4 = "metre";
    pcVar2 = "metre";
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar2 + 5);
  return __return_storage_ptr__;
}

Assistant:

std::string convertNonSiUnits(const std::string &unitsName)
{
    if (unitsName == "liter") {
        return "litre";
    }

    if (unitsName == "meter") {
        return "metre";
    }

    return unitsName;
}